

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O1

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::BindContext::GetBinding(BindContext *this,string *name,ErrorData *out_error)

{
  pointer pcVar1;
  optional_ptr<duckdb::Binding,_true> oVar2;
  string local_a0;
  BindingAlias local_80;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + name->_M_string_length);
  BindingAlias::BindingAlias(&local_80,&local_a0);
  oVar2 = GetBinding(this,&local_80,out_error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.alias._M_dataplus._M_p != &local_80.alias.field_2) {
    operator_delete(local_80.alias._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.schema._M_dataplus._M_p != &local_80.schema.field_2) {
    operator_delete(local_80.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.catalog._M_dataplus._M_p != &local_80.catalog.field_2) {
    operator_delete(local_80.catalog._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return (optional_ptr<duckdb::Binding,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<Binding> BindContext::GetBinding(const string &name, ErrorData &out_error) {
	return GetBinding(BindingAlias(name), out_error);
}